

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

intptr_t fio_connect(fio_connect_args args)

{
  void *uuid_;
  undefined8 *protocol_;
  uintptr_t uVar1;
  code *pcVar2;
  int *piVar3;
  
  if (((args.on_connect == (_func_void_intptr_t_void_ptr *)0x0) &&
      ((args.tls == (void *)0x0 || (uVar1 = fio_tls_alpn_count(args.tls), uVar1 == 0)))) ||
     (args.address == (char *)0x0 && args.port == (char *)0x0)) {
    piVar3 = __errno_location();
    *piVar3 = 0x16;
  }
  else {
    uuid_ = (void *)fio_socket(args.address,args.port,'\0');
    if (uuid_ != (void *)0xffffffffffffffff) {
      fio_timeout_set((intptr_t)uuid_,args.timeout);
      protocol_ = (undefined8 *)fio_malloc(0x58);
      if (protocol_ == (undefined8 *)0x0) {
        if (0 < FIO_LOG_LEVEL) {
          FIO_LOG2STDERR(
                        "FATAL: memory allocation error /workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fio.c:4753"
                        );
        }
        kill(0,2);
        piVar3 = __errno_location();
        exit(*piVar3);
      }
      if (args.tls == (void *)0x0) {
        pcVar2 = fio_connect_on_ready;
      }
      else {
        fio_tls_dup(args.tls);
        uVar1 = fio_tls_alpn_count(args.tls);
        pcVar2 = fio_connect_on_ready_tls_alpn;
        if (uVar1 == 0) {
          pcVar2 = fio_connect_on_ready_tls;
        }
      }
      *protocol_ = 0;
      protocol_[1] = pcVar2;
      protocol_[2] = 0;
      protocol_[3] = fio_connect_on_close;
      protocol_[4] = 0;
      protocol_[5] = 0;
      protocol_[6] = uuid_;
      protocol_[7] = args.udata;
      protocol_[8] = args.tls;
      protocol_[9] = args.on_connect;
      protocol_[10] = args.on_fail;
      fio_attach__internal(uuid_,protocol_);
      return (intptr_t)uuid_;
    }
  }
  if (args.on_fail != (_func_void_intptr_t_void_ptr *)0x0) {
    (*args.on_fail)(-1,args.udata);
  }
  return -1;
}

Assistant:

intptr_t fio_connect FIO_IGNORE_MACRO(struct fio_connect_args args) {
  if ((!args.on_connect && (!args.tls || !fio_tls_alpn_count(args.tls))) ||
      (!args.address && !args.port)) {
    errno = EINVAL;
    goto error;
  }
  const intptr_t uuid = fio_socket(args.address, args.port, 0);
  if (uuid == -1)
    goto error;
  fio_timeout_set(uuid, args.timeout);

  fio_connect_protocol_s *pr = fio_malloc(sizeof(*pr));
  FIO_ASSERT_ALLOC(pr);

  if (args.tls)
    fio_tls_dup(args.tls);

  *pr = (fio_connect_protocol_s){
      .pr =
          {
              .on_ready = (args.tls ? (fio_tls_alpn_count(args.tls)
                                           ? fio_connect_on_ready_tls_alpn
                                           : fio_connect_on_ready_tls)
                                    : fio_connect_on_ready),
              .on_close = fio_connect_on_close,
          },
      .uuid = uuid,
      .tls = args.tls,
      .udata = args.udata,
      .on_connect = args.on_connect,
      .on_fail = args.on_fail,
  };
  fio_attach(uuid, &pr->pr);
  return uuid;
error:
  if (args.on_fail)
    args.on_fail(-1, args.udata);
  return -1;
}